

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void * private_ACUtilsTest_ADynArray_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  if ((private_ACUtilsTest_ADynArray_reallocFail &
      private_ACUtilsTest_ADynArray_reallocFailCounter == 0) == 0) {
    if (private_ACUtilsTest_ADynArray_reallocFail != 0) {
      private_ACUtilsTest_ADynArray_reallocFailCounter =
           private_ACUtilsTest_ADynArray_reallocFailCounter - 1;
    }
    pvVar1 = realloc(ptr,size);
    if (pvVar1 != (void *)0x0) {
      private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_reallocCount + 1;
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* private_ACUtilsTest_ADynArray_realloc(void *ptr, size_t size) {
    if(!private_ACUtilsTest_ADynArray_reallocFail || private_ACUtilsTest_ADynArray_reallocFailCounter > 0) {
        if(private_ACUtilsTest_ADynArray_reallocFail)
            --private_ACUtilsTest_ADynArray_reallocFailCounter;
        void* tmp = realloc(ptr, size);
        if(tmp != nullptr)
            ++private_ACUtilsTest_ADynArray_reallocCount;
        return tmp;
    }
    return nullptr;
}